

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void FunctionalTester<int,_void>::Test(void)

{
  int x;
  pointer pvVar1;
  pointer str2;
  int *arg;
  undefined1 local_a4 [8];
  buf_t buf2;
  int local_58 [2];
  int i;
  int imax;
  int imin;
  buf_t buf1;
  TestWatcher<int> tw;
  
  TestWatcher<int>::TestWatcher((TestWatcher<int> *)(buf1._M_elems + 0x38));
  i = -0x80000000;
  local_58[1] = 0x7fffffff;
  for (local_58[0] = -0x80000000; x = local_58[0], local_58[0] < 0x7fffffff;
      local_58[0] = local_58[0] + 1) {
    pvVar1 = std::array<char,_64UL>::data((array<char,_64UL> *)((long)&imax + 3));
    int2str::convert_with_zero<int,char*>(x,pvVar1);
    boost::lexical_cast<std::array<char,64ul>,int>
              ((array<char,_64UL> *)local_a4,(boost *)local_58,arg);
    pvVar1 = std::array<char,_64UL>::data((array<char,_64UL> *)((long)&imax + 3));
    str2 = std::array<char,_64UL>::data((array<char,_64UL> *)local_a4);
    StrcmpAndExit(pvVar1,str2);
  }
  TestWatcher<int>::~TestWatcher((TestWatcher<int> *)(buf1._M_elems + 0x38));
  return;
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        typedef std::array<char, 64> buf_t;
        buf_t buf1;
        T const imin = std::numeric_limits<T>::min();
        T const imax = std::numeric_limits<T>::max();
        for (T i = imin; i < imax; ++i)
        {
            int2str::convert_with_zero(i, buf1.data());
#ifdef USE_BOOST
            buf_t buf2 = boost::lexical_cast<buf_t>(i);
#else
            buf_t buf2;
            sprintf(buf2.data(), PrintfFormat<T>(), i);
#endif
            StrcmpAndExit(buf1.data(), buf2.data());
        }
    }